

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::do_regular
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy> *this,
          int32_t qs,int32_t param_2,int32_t predicted,decoder_strategy *param_4)

{
  uint uVar1;
  int32_t length;
  ushort uVar2;
  int32_t k;
  uint uVar3;
  uint uVar4;
  int iVar5;
  context_regular_mode *this_00;
  
  iVar5 = -qs;
  if (0 < qs) {
    iVar5 = qs;
  }
  this_00 = (this->contexts_)._M_elems + iVar5;
  k = context_regular_mode::get_golomb_coding_parameter(this_00);
  uVar1 = (this->contexts_)._M_elems[iVar5].c_;
  uVar3 = decoder_strategy::peek_byte(&this->super_decoder_strategy);
  length = *(int32_t *)((long)k * 0x800 + 0x1401ac + (ulong)uVar3 * 8);
  if (length == 0) {
    uVar3 = decode_value(this,k,0x40,0x10);
    uVar3 = (int)uVar3 >> 1 ^ -(uVar3 & 1);
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if (0xffff < uVar4) {
      impl::throw_jpegls_error(InvalidCompressedData);
    }
  }
  else {
    decoder_strategy::skip(&this->super_decoder_strategy,length);
    uVar3 = *(uint *)(decoding_tables + (ulong)uVar3 * 8 + (long)k * 0x800);
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if (0xfffe < uVar4) {
      __assert_fail("std::abs(error_value) < 65535",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x13f,
                    "sample_type charls::jls_codec<charls::lossless_traits<uint16_t, 16>, charls::decoder_strategy>::do_regular(const int32_t, int32_t, const int32_t, decoder_strategy *) [Traits = charls::lossless_traits<uint16_t, 16>, Strategy = charls::decoder_strategy]"
                   );
    }
  }
  if (k == 0) {
    uVar3 = uVar3 ^ (this->contexts_)._M_elems[iVar5].n_ + (this->contexts_)._M_elems[iVar5].b_ * 2
                    + -1 >> 0x1f;
  }
  iVar5 = (predicted - (qs >> 0x1f)) + (uVar1 ^ qs >> 0x1f);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfffe < iVar5) {
    iVar5 = 0xffff;
  }
  context_regular_mode::update_variables_and_bias(this_00,uVar3,0,0x40);
  uVar2 = (ushort)(qs >> 0x1f);
  return (((ushort)uVar3 ^ uVar2) - uVar2) + (short)iVar5;
}

Assistant:

do_regular(const int32_t qs, int32_t /*x*/, const int32_t predicted,
                                        decoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};

        int32_t error_value;
        const golomb_code& code = decoding_tables[k].get(Strategy::peek_byte());
        if (code.length() != 0)
        {
            Strategy::skip(code.length());
            error_value = code.value();
            ASSERT(std::abs(error_value) < 65535);
        }
        else
        {
            error_value = unmap_error_value(decode_value(k, traits_.limit, traits_.quantized_bits_per_pixel));
            if (UNLIKELY(std::abs(error_value) > 65535))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }
        if (k == 0)
        {
            error_value = error_value ^ context.get_error_correction(traits_.near_lossless);
        }
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        error_value = apply_sign(error_value, sign);
        return traits_.compute_reconstructed_sample(predicted_value, error_value);
    }